

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::CommentInfo::setComment(CommentInfo *this,char *text,size_t len)

{
  char *pcVar1;
  char *in_RSI;
  string *in_RDI;
  ostringstream oss;
  string local_1e8 [32];
  size_t in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  allocator local_39;
  string local_38 [40];
  char *local_10;
  
  local_10 = in_RSI;
  if (*(long *)in_RDI != 0) {
    releaseStringValue((char *)0x15647f);
    *(long *)in_RDI = 0;
  }
  if (local_10 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"assert json failed",&local_39);
    throwLogicError(in_RDI);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if ((*local_10 != '\0') && (*local_10 != '/')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe38);
    std::operator<<((ostream *)&stack0xfffffffffffffe38,
                    "in Json::Value::setComment(): Comments must start with /");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_RDI);
    std::__cxx11::string::~string(local_1e8);
    abort();
  }
  pcVar1 = duplicateStringValue(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  *(char **)in_RDI = pcVar1;
  return;
}

Assistant:

void Value::CommentInfo::setComment(const char* text, size_t len) {
  if (comment_) {
    releaseStringValue(comment_);
    comment_ = 0;
  }
  JSON_ASSERT(text != 0);
  JSON_ASSERT_MESSAGE(
      text[0] == '\0' || text[0] == '/',
      "in Json::Value::setComment(): Comments must start with /");
  // It seems that /**/ style comments are acceptable as well.
  comment_ = duplicateStringValue(text, len);
}